

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
emplaceRealloc<slang::ast::RecursiveStructMemberIterator::State&>
          (SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *this,pointer pos,
          State *args)

{
  size_t *psVar1;
  ulong uVar2;
  size_type sVar3;
  undefined8 *puVar4;
  ConstantValue *pCVar5;
  Type *pTVar6;
  Symbol *pSVar7;
  pointer pSVar8;
  pointer pSVar9;
  State *__cur;
  pointer pSVar10;
  EVP_PKEY_CTX *ctx;
  long lVar11;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar11 = (long)pos - (long)this->data_;
  ctx = (EVP_PKEY_CTX *)0x28;
  pSVar8 = (pointer)detail::allocArray(capacity,0x28);
  *(Symbol **)((long)pSVar8 + lVar11 + 0x20) = (args->fieldEnd).current;
  pCVar5 = args->val;
  pTVar6 = args->type;
  pSVar7 = (args->fieldIt).current;
  psVar1 = (size_t *)((long)pSVar8 + lVar11 + 0x10);
  *psVar1 = args->valIndex;
  psVar1[1] = (size_t)pSVar7;
  *(undefined8 *)((long)pSVar8 + lVar11) = pCVar5;
  ((undefined8 *)((long)pSVar8 + lVar11))[1] = pTVar6;
  pSVar9 = this->data_;
  pSVar10 = pSVar8;
  if (pSVar9 + this->len == pos) {
    for (; pSVar9 != pos; pSVar9 = pSVar9 + 1) {
      (pSVar10->fieldEnd).current = (pSVar9->fieldEnd).current;
      pCVar5 = pSVar9->val;
      pTVar6 = pSVar9->type;
      pSVar7 = (pSVar9->fieldIt).current;
      pSVar10->valIndex = pSVar9->valIndex;
      (pSVar10->fieldIt).current = pSVar7;
      pSVar10->val = pCVar5;
      pSVar10->type = pTVar6;
      pSVar10 = pSVar10 + 1;
    }
  }
  else {
    for (; pSVar9 != pos; pSVar9 = pSVar9 + 1) {
      (pSVar10->fieldEnd).current = (pSVar9->fieldEnd).current;
      pCVar5 = pSVar9->val;
      pTVar6 = pSVar9->type;
      pSVar7 = (pSVar9->fieldIt).current;
      pSVar10->valIndex = pSVar9->valIndex;
      (pSVar10->fieldIt).current = pSVar7;
      pSVar10->val = pCVar5;
      pSVar10->type = pTVar6;
      pSVar10 = pSVar10 + 1;
    }
    sVar3 = this->len;
    pSVar9 = this->data_;
    puVar4 = (undefined8 *)((long)pSVar8 + lVar11);
    for (; pos != pSVar9 + sVar3; pos = pos + 1) {
      puVar4[9] = (pos->fieldEnd).current;
      pCVar5 = pos->val;
      pTVar6 = pos->type;
      pSVar7 = (pos->fieldIt).current;
      puVar4[7] = pos->valIndex;
      puVar4[8] = pSVar7;
      puVar4[5] = pCVar5;
      puVar4[6] = pTVar6;
      puVar4 = puVar4 + 5;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pSVar8;
  return (pointer)((long)pSVar8 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}